

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O3

void gdImageFilledArc(gdImagePtr im,int cx,int cy,int w,int h,int s,int e,int color,int style)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  int x2;
  int iVar5;
  uint uVar6;
  int x1;
  int x2_00;
  ulong uVar7;
  int y2;
  int iVar8;
  int iVar9;
  int y2_00;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  bool bVar13;
  gdPoint pts [3];
  gdPoint local_58;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  long local_40;
  long local_38;
  
  uVar6 = 0x168;
  uVar12 = 0;
  if (s % 0x168 == e % 0x168) {
LAB_0010ed48:
    iVar5 = 0;
    local_38 = (long)w;
    local_40 = (long)h;
    iVar11 = (int)uVar12;
    y2 = 0;
    x2 = 0;
    iVar9 = 0;
    x1 = 0;
    do {
      uVar4 = (ulong)(uint)(((int)uVar12 + (int)(uVar12 / 0x168) * -0x168) * 4);
      uVar3 = *(int *)((long)gdCosT + uVar4) * local_38;
      uVar7 = uVar3 + 0x7ff;
      if (-1 < (long)uVar3) {
        uVar7 = uVar3;
      }
      x2_00 = (int)(uVar7 >> 0xb) + cx;
      uVar3 = *(int *)((long)gdSinT + uVar4) * local_40;
      uVar7 = uVar3 + 0x7ff;
      if (-1 < (long)uVar3) {
        uVar7 = uVar3;
      }
      y2_00 = (int)(uVar7 >> 0xb) + cy;
      bVar13 = iVar5 == 0;
      iVar5 = iVar5 + -1;
      iVar8 = y2;
      iVar1 = x2;
      if (bVar13) {
        iVar8 = y2_00;
        iVar1 = x2_00;
      }
      if (!bVar13 && (style & 1U) == 0) {
        if ((style & 2U) == 0) {
          local_58.x = x1;
          local_58.y = iVar9;
          local_50 = x2_00;
          local_4c = y2_00;
          local_48 = cx;
          local_44 = cy;
          gdImageFilledPolygon(im,&local_58,3,color);
          iVar1 = x2;
          iVar8 = y2;
        }
        else {
          gdImageLine(im,x1,iVar9,x2_00,y2_00,color);
          iVar1 = x2;
          iVar8 = y2;
        }
      }
      y2 = iVar8;
      x2 = iVar1;
      uVar12 = (ulong)((int)uVar12 + 1);
      iVar9 = y2_00;
      x1 = x2_00;
    } while (~uVar6 + iVar11 != iVar5);
  }
  else {
    uVar10 = s % 0x168;
    if (s < 0x169) {
      uVar10 = s;
    }
    x2_00 = 0;
    uVar6 = 0;
    if (0 < (int)uVar10) {
      uVar6 = uVar10;
    }
    uVar2 = e % 0x168;
    if (e < 0x169) {
      uVar2 = e;
    }
    uVar10 = (((uVar6 - uVar10) + ((int)uVar10 >> 0x1f)) / 0x168 - ((int)uVar10 >> 0x1f)) * 0x168 +
             uVar10;
    uVar6 = uVar10;
    if ((int)uVar10 < (int)uVar2) {
      uVar6 = uVar2;
    }
    uVar2 = (((uVar6 - uVar2) - (uint)((int)uVar2 < (int)uVar10)) / 0x168 +
            (uint)((int)uVar2 < (int)uVar10)) * 0x168 + uVar2;
    uVar6 = 0x168;
    if (uVar10 != uVar2) {
      uVar6 = uVar2;
    }
    uVar12 = (ulong)uVar10;
    if (uVar10 == uVar2) {
      uVar12 = 0;
    }
    if ((int)uVar12 <= (int)uVar6) goto LAB_0010ed48;
    y2_00 = 0;
    x2 = 0;
    y2 = 0;
  }
  if ((style & 1U) == 0) {
    if ((~style & 6U) == 0) {
      gdImageLine(im,cx,cy,x2_00,y2_00,color);
      x2_00 = x2;
      iVar9 = cy;
      x2 = cx;
      y2_00 = y2;
      goto LAB_0010ef6f;
    }
  }
  else {
    if ((style & 2U) != 0) {
      iVar9 = y2;
      if ((style & 4U) != 0) {
        gdImageLine(im,cx,cy,x2_00,y2_00,color);
        gdImageLine(im,cx,cy,x2,y2,color);
      }
LAB_0010ef6f:
      gdImageLine(im,x2,iVar9,x2_00,y2_00,color);
      return;
    }
    local_58.x = x2;
    local_58.y = y2;
    local_50 = x2_00;
    local_4c = y2_00;
    local_48 = cx;
    local_44 = cy;
    gdImageFilledPolygon(im,&local_58,3,color);
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageFilledArc (gdImagePtr im, int cx, int cy, int w, int h, int s, int e,
									int color, int style)
{
	gdPoint pts[3];
	int i;
	int lx = 0, ly = 0;
	int fx = 0, fy = 0;

	if ((s % 360)  == (e % 360)) {
		s = 0;
		e = 360;
	} else {
		if (s > 360) {
			s = s % 360;
		}

		if (e > 360) {
			e = e % 360;
		}

		while (s < 0) {
			s += 360;
		}

		while (e < s) {
			e += 360;
		}

		if (s == e) {
			s = 0;
			e = 360;
		}
	}

	for (i = s; (i <= e); i++) {
		int x, y;
		x = ((long) gdCosT[i % 360] * (long) w / (2 * 1024)) + cx;
		y = ((long) gdSinT[i % 360] * (long) h / (2 * 1024)) + cy;
		if (i != s) {
			if (!(style & gdChord)) {
				if (style & gdNoFill) {
					gdImageLine (im, lx, ly, x, y, color);
				} else {
					/* This is expensive! */
					pts[0].x = lx;
					pts[0].y = ly;
					pts[1].x = x;
					pts[1].y = y;
					pts[2].x = cx;
					pts[2].y = cy;
					gdImageFilledPolygon (im, pts, 3, color);
				}
			}
		} else {
			fx = x;
			fy = y;
		}
		lx = x;
		ly = y;
	}
	if (style & gdChord) {
		if (style & gdNoFill) {
			if (style & gdEdged) {
				gdImageLine (im, cx, cy, lx, ly, color);
				gdImageLine (im, cx, cy, fx, fy, color);
			}
			gdImageLine (im, fx, fy, lx, ly, color);
		} else {
			pts[0].x = fx;
			pts[0].y = fy;
			pts[1].x = lx;
			pts[1].y = ly;
			pts[2].x = cx;
			pts[2].y = cy;
			gdImageFilledPolygon (im, pts, 3, color);
		}
	} else {
		if (style & gdNoFill) {
			if (style & gdEdged) {
				gdImageLine (im, cx, cy, lx, ly, color);
				gdImageLine (im, cx, cy, fx, fy, color);
			}
		}
	}
}